

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pool.c
# Opt level: O0

void * pool_buffer_add_move(chck_pool_buffer *pb,void *data,size_t pos,size_t *out_index)

{
  size_t shift;
  void *ptr;
  size_t *out_index_local;
  size_t pos_local;
  void *data_local;
  chck_pool_buffer *pb_local;
  
  out_index_local = (size_t *)pos;
  if (pb->used < pos) {
    out_index_local = (size_t *)pb->used;
  }
  shift = (size_t)pool_buffer_add(pb,data,pb->used,out_index);
  if ((void *)shift == (void *)0x0) {
    pb_local = (chck_pool_buffer *)0x0;
  }
  else {
    if (pb->used < pb->member) {
      __assert_fail("pb->used >= pb->member",
                    "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/pool/pool.c"
                    ,0x89,
                    "void *pool_buffer_add_move(struct chck_pool_buffer *, const void *, size_t, size_t *)"
                   );
    }
    if ((size_t *)pb->used <= out_index_local) {
      __assert_fail("pb->used > pos",
                    "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/pool/pool.c"
                    ,0x8a,
                    "void *pool_buffer_add_move(struct chck_pool_buffer *, const void *, size_t, size_t *)"
                   );
    }
    if (pb->member < pb->used) {
      memmove((uint8_t *)((long)out_index_local + (long)(pb->buffer + pb->member)),
              pb->buffer + (long)out_index_local,pb->used - ((long)out_index_local + pb->member));
      shift = (size_t)(pb->buffer + (long)out_index_local);
    }
    if (data == (void *)0x0) {
      memset((void *)shift,0,pb->member);
    }
    else {
      memcpy((void *)shift,data,pb->member);
    }
    pb_local = (chck_pool_buffer *)shift;
  }
  return pb_local;
}

Assistant:

static void*
pool_buffer_add_move(struct chck_pool_buffer *pb, const void *data, size_t pos, size_t *out_index)
{
   if (pos > pb->used)
      pos = pb->used;

   void *ptr;
   if (!(ptr = pool_buffer_add(pb, data, pb->used, out_index)))
      return NULL;

   assert(pb->used >= pb->member);
   assert(pb->used > pos);

   if (pb->used > pb->member) {
      const size_t shift = pb->used - (pos + pb->member);
      memmove(pb->buffer + pos + pb->member, pb->buffer + pos, shift);
      ptr = pb->buffer + pos;
   }

   if (data) {
      memcpy(ptr, data, pb->member);
   } else {
      memset(ptr, 0, pb->member);
   }

   return ptr;
}